

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_enc.c
# Opt level: O0

void VP8LEncoderDelete(VP8LEncoder *enc)

{
  long in_RDI;
  int i;
  undefined4 in_stack_fffffffffffffff0;
  int iVar1;
  
  if (in_RDI != 0) {
    VP8LHashChainClear((VP8LHashChain *)0x1aeba2);
    for (iVar1 = 0; iVar1 < 4; iVar1 = iVar1 + 1) {
      VP8LBackwardRefsClear((VP8LBackwardRefs *)CONCAT44(iVar1,in_stack_fffffffffffffff0));
    }
    ClearTransformBuffer((VP8LEncoder *)0x1aebe5);
    WebPSafeFree((void *)0x1aebef);
  }
  return;
}

Assistant:

static void VP8LEncoderDelete(VP8LEncoder* enc) {
  if (enc != NULL) {
    int i;
    VP8LHashChainClear(&enc->hash_chain);
    for (i = 0; i < 4; ++i) VP8LBackwardRefsClear(&enc->refs[i]);
    ClearTransformBuffer(enc);
    WebPSafeFree(enc);
  }
}